

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pIVar3 = GImGui;
  uVar6 = (ulong)(flags & 1);
  uVar5 = data_type & 0xfffffffe;
  bVar7 = uVar5 == 8;
  bVar2 = power != 1.0;
  fVar15 = (&(bb->Min).x)[uVar6];
  fVar1 = (&(bb->Max).x)[uVar6];
  fVar16 = (fVar1 - fVar15) + -4.0;
  fVar13 = (GImGui->Style).GrabMinSize;
  fVar14 = v_max - v_min;
  fVar17 = (float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                  -(uint)(v_min < v_max) & (uint)fVar14);
  if ((uVar5 != 8) && (0.0 <= fVar17)) {
    fVar12 = fVar16 / (fVar17 + 1.0);
    uVar8 = -(uint)(fVar13 <= fVar12);
    fVar13 = (float)(~uVar8 & (uint)fVar13 | (uint)fVar12 & uVar8);
  }
  if (fVar16 <= fVar13) {
    fVar13 = fVar16;
  }
  if ((!bVar2 || !bVar7) || 0.0 <= v_min * v_max) {
    fVar12 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    uVar8 = -(uint)(-v_min <= v_min);
    fVar12 = powf((float)(uVar8 & (uint)v_min | ~uVar8 & (uint)-v_min),1.0 / power);
    uVar8 = -(uint)(-v_max <= v_max);
    fVar9 = powf((float)(uVar8 & (uint)v_max | ~uVar8 & (uint)-v_max),1.0 / power);
    fVar12 = fVar12 / (fVar9 + fVar12);
  }
  fVar15 = fVar15 + 2.0 + fVar13 * 0.5;
  if (pIVar3->ActiveId == id) {
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar11 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar9 = IVar11.x;
      if (uVar6 != 0) {
        fVar9 = -IVar11.y;
      }
      if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar9 != 0.0) || (NAN(fVar9))) {
        fVar10 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar12);
        if ((uVar5 != 8) ||
           (iVar4 = ImParseFormatPrecision(format,3), (bool)(~(bVar2 && bVar7) & iVar4 < 1))) {
          if ((ABS(fVar17) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar9 = *(float *)(&DAT_00159818 + (ulong)(fVar9 < 0.0) * 4) / fVar17;
          }
          else {
            fVar9 = fVar9 / 100.0;
          }
        }
        else {
          fVar9 = fVar9 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar9 = fVar9 / 10.0;
          }
        }
        uVar8 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar17 = (float)(~uVar8 & (uint)fVar9 | (uint)(fVar9 * 10.0) & uVar8);
        if ((1.0 <= fVar10) && (0.0 < fVar17)) {
          bVar2 = false;
          goto LAB_00150f68;
        }
        if ((0.0 < fVar10) || (0.0 <= fVar17)) {
          fVar10 = fVar10 + fVar17;
          fVar17 = 1.0;
          if (fVar10 <= 1.0) {
            fVar17 = fVar10;
          }
          fVar17 = (float)(~-(uint)(fVar10 < 0.0) & (uint)fVar17);
          goto LAB_0015120a;
        }
        goto LAB_00150f65;
      }
      bVar2 = false;
      goto LAB_00150f68;
    }
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar3->IO).MouseDown[0] != false) {
        fVar17 = 0.0;
        if (0.0 < fVar16 - fVar13) {
          fVar9 = (*(float *)((pIVar3->IO).MouseDown + uVar6 * 4 + -8) - fVar15) / (fVar16 - fVar13)
          ;
          fVar17 = 1.0;
          if (fVar9 <= 1.0) {
            fVar17 = fVar9;
          }
          fVar17 = (float)(~-(uint)(fVar9 < 0.0) & (uint)fVar17);
        }
        if (uVar6 != 0) {
          fVar17 = 1.0 - fVar17;
        }
LAB_0015120a:
        if (bVar2 && bVar7) {
          if (fVar12 <= fVar17) {
            uVar5 = -(uint)(1e-06 < ABS(fVar12 + -1.0));
            fVar14 = powf((float)(~uVar5 & (uint)fVar17 |
                                 (uint)((fVar17 - fVar12) / (1.0 - fVar12)) & uVar5),power);
            fVar17 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
            fVar17 = (v_max - fVar17) * fVar14 + fVar17;
          }
          else {
            fVar14 = powf(1.0 - fVar17 / fVar12,power);
            fVar17 = v_max;
            if (0.0 <= v_max) {
              fVar17 = 0.0;
            }
            fVar17 = (v_min - fVar17) * fVar14 + fVar17;
          }
        }
        else {
          if (uVar5 == 8) {
            fVar17 = fVar14 * fVar17;
          }
          else {
            fVar14 = fVar14 * fVar17;
            fVar17 = fVar14 + 0.5;
            if (fVar14 + 0.5 <= fVar14) {
              fVar17 = fVar14;
            }
          }
          fVar17 = fVar17 + v_min;
        }
        fVar14 = RoundScalarWithFormatT<float,float>(format,data_type,fVar17);
        if ((*v != fVar14) || (NAN(*v) || NAN(fVar14))) {
          *v = fVar14;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        goto LAB_00150f68;
      }
      ClearActiveID();
    }
  }
LAB_00150f65:
  bVar2 = false;
LAB_00150f68:
  if (1.0 <= fVar16) {
    fVar14 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar12);
    if (uVar6 != 0) {
      fVar14 = 1.0 - fVar14;
    }
    fVar15 = (((fVar1 + -2.0) - fVar13 * 0.5) - fVar15) * fVar14 + fVar15;
    if (uVar6 == 0) {
      fVar1 = (bb->Min).y;
      fVar14 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar14 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar13 * 0.5 + fVar15;
    }
  }
  else {
    IVar11 = bb->Min;
    out_grab_bb->Min = IVar11;
    out_grab_bb->Max = IVar11;
  }
  return bVar2;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}